

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.cc
# Opt level: O1

MENU * updateMenu(MENU *menu,WINDOW *win,SatLookAngles *sats,ITEM **items,string *itemStrs,
                 bool updatePositions)

{
  pointer pcVar1;
  bool bVar2;
  WINDOW *pWVar3;
  char cVar4;
  uint uVar5;
  ITEM *pIVar6;
  ostream *poVar7;
  ITEM *pIVar8;
  MENU *pMVar9;
  undefined8 uVar10;
  ulong uVar11;
  string *this;
  char cVar12;
  undefined3 in_register_00000089;
  pointer ppVar13;
  ulong uVar14;
  string __str;
  stringstream ss;
  int local_290;
  int local_28c;
  long *local_280;
  uint local_278;
  undefined4 uStack_274;
  long local_270 [2];
  ITEM **local_260;
  long *local_258;
  long local_250;
  long local_248 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  MENU *local_1d8;
  WINDOW *local_1d0;
  ulong local_1c8;
  string *local_1c0;
  stringstream local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  local_260 = items;
  local_1c0 = itemStrs;
  if (CONCAT31(in_register_00000089,updatePositions) != 0) {
    SatLookAngles::updateTimeAndPositions(sats);
    SatLookAngles::sort(sats);
  }
  if (win == (WINDOW *)0x0) {
    local_290 = -6;
    local_28c = -3;
  }
  else {
    local_290 = win->_maxy + -4;
    local_28c = win->_maxx + -1;
  }
  local_1d8 = menu;
  local_1d0 = win;
  pIVar6 = (ITEM *)current_item(menu);
  uVar5 = item_index(pIVar6);
  ppVar13 = (sats->_sats).
            super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((sats->_sats).
      super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar13) {
    uVar14 = 0;
    local_1c8 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      local_1c8 = uVar14;
    }
    do {
      std::__cxx11::stringstream::stringstream(local_1b8);
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x20;
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 10;
      cVar12 = '\x01';
      if (9 < uVar14) {
        uVar11 = uVar14;
        cVar4 = '\x04';
        do {
          cVar12 = cVar4;
          if (uVar11 < 100) {
            cVar12 = cVar12 + -2;
            goto LAB_0010e2cf;
          }
          if (uVar11 < 1000) {
            cVar12 = cVar12 + -1;
            goto LAB_0010e2cf;
          }
          if (uVar11 < 10000) goto LAB_0010e2cf;
          bVar2 = 99999 < uVar11;
          uVar11 = uVar11 / 10000;
          cVar4 = cVar12 + '\x04';
        } while (bVar2);
        cVar12 = cVar12 + '\x01';
      }
LAB_0010e2cf:
      local_280 = local_270;
      std::__cxx11::string::_M_construct((ulong)&local_280,cVar12);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_280,local_278,uVar14);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_280,CONCAT44(uStack_274,local_278));
      ppVar13 = ppVar13 + uVar14;
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0x19;
      local_258 = local_248;
      pcVar1 = (ppVar13->first).name_._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_258,pcVar1,pcVar1 + (ppVar13->first).name_._M_string_length);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)local_258,local_250);
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_1f8,vsnprintf,0x148,"%f",
                 ((ppVar13->second).azimuth * 180.0) / 3.141592653589793);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xf;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_218,vsnprintf,0x148,"%f",
                 ((ppVar13->second).elevation * 180.0) / 3.141592653589793);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_218._M_dataplus._M_p,local_218._M_string_length);
      *(undefined8 *)(poVar7 + *(long *)(*(long *)poVar7 + -0x18) + 0x10) = 0xc;
      __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                (&local_238,vsnprintf,0x148,"%f",(ppVar13->second).range);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,local_238._M_dataplus._M_p,local_238._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (local_258 != local_248) {
        operator_delete(local_258,local_248[0] + 1);
      }
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      std::__cxx11::stringbuf::str();
      this = local_1c0 + uVar14;
      std::__cxx11::string::operator=((string *)this,(string *)&local_280);
      if (local_280 != local_270) {
        operator_delete(local_280,local_270[0] + 1);
      }
      if (local_260[uVar14] != (ITEM *)0x0) {
        free_item();
      }
      pIVar8 = (ITEM *)new_item((this->_M_dataplus)._M_p,0);
      local_260[uVar14] = pIVar8;
      if (uVar14 == local_1c8) {
        pIVar6 = pIVar8;
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      uVar14 = uVar14 + 1;
      ppVar13 = (sats->_sats).
                super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)(((long)(sats->_sats).
                                     super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar13 >> 3
                              ) * -0x1084210842108421));
  }
  pMVar9 = local_1d8;
  if (local_1d8 != (MENU *)0x0) {
    unpost_menu(local_1d8);
    free_menu(pMVar9);
  }
  pMVar9 = (MENU *)new_menu(local_260);
  set_menu_mark(pMVar9,"->");
  uVar14 = ((long)(sats->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(sats->_sats).
                  super__Vector_base<std::pair<Tle,_CoordTopocentric>,_std::allocator<std::pair<Tle,_CoordTopocentric>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x1084210842108421;
  if ((ulong)(long)local_290 <= uVar14) {
    uVar14 = (long)local_290;
  }
  set_menu_format(pMVar9,uVar14,1);
  pWVar3 = local_1d0;
  set_menu_win(pMVar9,local_1d0);
  uVar10 = derwin(pWVar3,local_290,local_28c,2,1);
  set_menu_sub(pMVar9,uVar10);
  set_current_item(pMVar9,pIVar6);
  post_menu(pMVar9);
  return pMVar9;
}

Assistant:

static MENU *updateMenu(MENU *menu, WINDOW *win, SatLookAngles &sats,
                        ITEM **items, std::string *itemStrs,
                        bool updatePositions) {
  if (updatePositions) {
    sats.updateTimeAndPositions();
    sats.sort();
  }

  int rows, cols;
  getmaxyx(win, rows, cols);

  // Remember cursor position so we can restore it.
  ITEM *curItem = current_item(menu);
  int curIdx = item_index(curItem);
  if (curIdx < 0)
    curIdx = 0;

  // Create the strings (items) for the menu.
  for (size_t i = 0; i < sats.size(); ++i) {
    const auto &tle = sats[i].first;
    const auto &la = sats[i].second;
    std::stringstream ss;
    ss << std::left << std::setw(10) << std::to_string(i) << std::setw(25)
       << tle.Name() << std::setw(15)
       << std::to_string(Util::RadiansToDegrees(la.azimuth)) << std::setw(15)
       << std::to_string(Util::RadiansToDegrees(la.elevation)) << std::setw(12)
       << std::to_string(la.range);
    itemStrs[i] = ss.str();
    if (items[i])
      free_item(items[i]);
    items[i] = new_item(itemStrs[i].c_str(), nullptr);

    if (i == (size_t)curIdx)
      curItem = items[i]; // Updated item at cursor position.
  }

  // Rebuild the menu (freeing the previous one).
  if (menu) {
    unpost_menu(menu);
    free_menu(menu);
  }
  menu = new_menu(items);
  set_menu_mark(menu, "->");
  set_menu_format(menu, std::min(sats.size(), (size_t)rows - 5), 1);
  set_menu_win(menu, win);
  set_menu_sub(menu, derwin(win, rows - 5, cols - 2, 2, 1));
  set_current_item(menu, curItem);
  post_menu(menu);
  return menu;
}